

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O0

int __thiscall FTeam::GetTextColor(FTeam *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  BYTE *pBStack_20;
  int iColor;
  BYTE *pColor;
  FTeam *this_local;
  
  pColor = (BYTE *)this;
  bVar1 = FString::IsEmpty(&this->m_TextColor);
  if (bVar1) {
    this_local._4_4_ = CR_UNTRANSLATED;
  }
  else {
    pBStack_20 = (BYTE *)FString::GetChars(&this->m_TextColor);
    this_local._4_4_ = V_ParseFontColor(&stack0xffffffffffffffe0,0,0);
    if (this_local._4_4_ == CR_UNDEFINED) {
      pcVar2 = FString::GetChars(&this->m_TextColor);
      pcVar3 = FString::GetChars(&this->m_Name);
      Printf("GetTextColor: Undefined color \'%s\' in definition of team \'%s\'.\n",pcVar2,pcVar3);
      this_local._4_4_ = CR_UNTRANSLATED;
    }
  }
  return this_local._4_4_;
}

Assistant:

int FTeam::GetTextColor () const
{
	if (m_TextColor.IsEmpty ())
		return CR_UNTRANSLATED;

	const BYTE *pColor = (const BYTE *)m_TextColor.GetChars ();
	int iColor = V_ParseFontColor (pColor, 0, 0);

	if (iColor == CR_UNDEFINED)
	{
		Printf ("GetTextColor: Undefined color '%s' in definition of team '%s'.\n", m_TextColor.GetChars (), m_Name.GetChars ());
		return CR_UNTRANSLATED;
	}

	return iColor;
}